

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

int nn_socket(int domain,int protocol)

{
  ushort uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  int iVar5;
  int extraout_EAX_00;
  long lVar6;
  char *pcVar7;
  nn_sock **ppnVar8;
  nn_list_item *pnVar9;
  nn_list_item *pnVar10;
  int *piVar11;
  nn_sock *self;
  nn_list_item **ppnVar12;
  short sVar13;
  ulong unaff_RBP;
  nn_socktype *socktype;
  ulong uVar14;
  nn_sock *pnStack_70;
  ulong uStack_68;
  ulong uStack_60;
  code *pcStack_58;
  ulong uStack_48;
  code *pcStack_40;
  
  uVar2 = (ulong)(uint)protocol;
  uVar14 = (ulong)(uint)domain;
  pcStack_40 = (code *)0x11f52a;
  nn_glock_lock();
  if ((::self.flags & 1U) == 0) {
    if (::self.socks == (nn_sock **)0x0) {
      pcStack_40 = (code *)0x11f54a;
      nn_alloc_init();
      pcStack_40 = (code *)0x11f551;
      nn_random_seed();
      iVar5 = 0x1400;
      pcStack_40 = (code *)0x11f55b;
      ::self.socks = (nn_sock **)nn_alloc_(0x1400);
      if (::self.socks == (nn_sock **)0x0) {
        pcStack_40 = (code *)0x11fa45;
        nn_socket_cold_4();
LAB_0011fa45:
        pcStack_40 = (code *)0x11fa4a;
        nn_socket_cold_2();
LAB_0011fa4a:
        pcStack_40 = nn_global_term;
        nn_socket_cold_3();
        uStack_48 = uVar2;
        pcStack_40 = (code *)uVar14;
        if (::self.socks != (nn_sock **)0x0) {
          if (::self.nsocks == 0) {
            pcStack_58 = (code *)0x11fa7f;
            nn_pool_term(&::self.pool);
            pcStack_58 = (code *)0x11fa8b;
            iVar5 = nn_list_empty(&::self.transports);
            while (iVar5 == 0) {
              pcStack_58 = (code *)0x11fa9e;
              pnVar9 = nn_list_begin(&::self.transports);
              ppnVar12 = &pnVar9[-4].prev;
              if (pnVar9 == (nn_list_item *)0x0) {
                ppnVar12 = (nn_list_item **)0x0;
              }
              if (ppnVar12[3] != (nn_list_item *)0x0) {
                pcStack_58 = (code *)0x11fab7;
                (*(code *)ppnVar12[3])();
              }
              pcStack_58 = (code *)0x11fac2;
              nn_list_erase(&::self.transports,pnVar9);
              pcStack_58 = (code *)0x11faca;
              iVar5 = nn_list_empty(&::self.transports);
            }
            pcStack_58 = (code *)0x11fada;
            iVar5 = nn_list_empty(&::self.socktypes);
            while (iVar5 == 0) {
              pcStack_58 = (code *)0x11faed;
              pnVar9 = nn_list_begin(&::self.socktypes);
              pcStack_58 = (code *)0x11faf8;
              nn_list_erase(&::self.socktypes,pnVar9);
              pcStack_58 = (code *)0x11fb00;
              iVar5 = nn_list_empty(&::self.socktypes);
            }
            pcStack_58 = (code *)0x11fb10;
            nn_list_term(&::self.socktypes);
            pcStack_58 = (code *)0x11fb1c;
            nn_list_term(&::self.transports);
            pcStack_58 = (code *)0x11fb28;
            nn_free(::self.socks);
            ::self.socks = (nn_sock **)0x0;
            nn_alloc_term();
            return extraout_EAX_00;
          }
          return extraout_EAX;
        }
        pcStack_58 = nn_close;
        nn_global_term_cold_1();
        uStack_68 = uVar2;
        uStack_60 = uVar14;
        pcStack_58 = (code *)unaff_RBP;
        nn_glock_lock();
        iVar3 = nn_global_hold_socket_locked(&pnStack_70,iVar5);
        if (iVar3 < 0) {
          nn_glock_unlock();
          piVar11 = __errno_location();
          *piVar11 = -iVar3;
        }
        else {
          nn_sock_stop(pnStack_70);
          nn_sock_rele(pnStack_70);
          nn_sock_rele(pnStack_70);
          nn_glock_unlock();
          iVar3 = nn_sock_term(pnStack_70);
          if (iVar3 != -4) {
            nn_glock_lock();
            ::self.socks[iVar5] = (nn_sock *)0x0;
            ::self.unused[0x200 - ::self.nsocks] = (uint16_t)iVar5;
            ::self.nsocks = ::self.nsocks - 1;
            nn_free(pnStack_70);
            nn_global_term();
            nn_glock_unlock();
            return 0;
          }
          nn_global_rele_socket(pnStack_70);
          piVar11 = __errno_location();
          *piVar11 = 4;
        }
        return -1;
      }
      lVar6 = 0;
      do {
        ::self.socks[lVar6] = (nn_sock *)0x0;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x200);
      ::self.nsocks = 0;
      ::self.flags = 0;
      pcStack_40 = (code *)0x11f5a8;
      pcVar7 = getenv("NN_PRINT_ERRORS");
      ::self.print_errors = 0;
      if (pcVar7 != (char *)0x0) {
        ::self.print_errors = (int)(*pcVar7 != '\0');
      }
      ppnVar8 = ::self.socks + 0x200;
      sVar13 = 0x1ff;
      lVar6 = 0;
      ::self.unused = (uint16_t *)ppnVar8;
      do {
        *(short *)((long)ppnVar8 + lVar6 * 2) = sVar13;
        lVar6 = lVar6 + 1;
        sVar13 = sVar13 + -1;
      } while (lVar6 != 0x200);
      pcStack_40 = (code *)0x11f5f2;
      nn_list_init(&::self.transports);
      pcStack_40 = (code *)0x11f601;
      nn_list_init(&::self.socktypes);
      pcStack_40 = (code *)0x11f610;
      nn_global_add_transport(nn_inproc);
      pcStack_40 = (code *)0x11f61f;
      nn_global_add_transport(nn_ipc);
      pcStack_40 = (code *)0x11f62e;
      nn_global_add_transport(nn_tcp);
      pcStack_40 = (code *)0x11f63d;
      nn_global_add_transport(nn_ws);
      pnVar10 = &nn_pair_socktype->item;
      pcStack_40 = (code *)0x11f653;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f661;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_xpair_socktype->item;
      pcStack_40 = (code *)0x11f677;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f685;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_pub_socktype->item;
      pcStack_40 = (code *)0x11f69b;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f6a9;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_sub_socktype->item;
      pcStack_40 = (code *)0x11f6bf;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f6cd;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_xpub_socktype->item;
      pcStack_40 = (code *)0x11f6e3;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f6f1;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_xsub_socktype->item;
      pcStack_40 = (code *)0x11f707;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f715;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_rep_socktype->item;
      pcStack_40 = (code *)0x11f72b;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f739;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_req_socktype->item;
      pcStack_40 = (code *)0x11f74f;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f75d;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_xrep_socktype->item;
      pcStack_40 = (code *)0x11f773;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f781;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_xreq_socktype->item;
      pcStack_40 = (code *)0x11f797;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f7a5;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_push_socktype->item;
      pcStack_40 = (code *)0x11f7bb;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f7c9;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_xpush_socktype->item;
      pcStack_40 = (code *)0x11f7df;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f7ed;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_pull_socktype->item;
      pcStack_40 = (code *)0x11f803;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f811;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_xpull_socktype->item;
      pcStack_40 = (code *)0x11f827;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f835;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_respondent_socktype->item;
      pcStack_40 = (code *)0x11f84b;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f859;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_surveyor_socktype->item;
      pcStack_40 = (code *)0x11f86f;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f87d;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_xrespondent_socktype->item;
      pcStack_40 = (code *)0x11f893;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f8a1;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_xsurveyor_socktype->item;
      pcStack_40 = (code *)0x11f8b7;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f8c5;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_bus_socktype->item;
      pcStack_40 = (code *)0x11f8db;
      pnVar9 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f8e9;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pnVar10 = &nn_xbus_socktype->item;
      pcStack_40 = (code *)0x11f8ff;
      pnVar9 = nn_list_end(&::self.socktypes);
      iVar5 = 0x14c5c8;
      pcStack_40 = (code *)0x11f90d;
      nn_list_insert(&::self.socktypes,pnVar10,pnVar9);
      pcStack_40 = (code *)0x11f912;
      iVar3 = nn_setup_atfork_handlers();
      if (iVar3 != 0) goto LAB_0011fa45;
      pcStack_40 = (code *)0x11f926;
      nn_pool_init(&::self.pool);
    }
    if (domain - 3U < 0xfffffffe) {
      uVar4 = 0xffffff9f;
    }
    else if (::self.nsocks < 0x200) {
      uVar1 = *(ushort *)((long)::self.unused + (ulong)(uint)((0x1ff - (int)::self.nsocks) * 2));
      unaff_RBP = (ulong)uVar1;
      pcStack_40 = (code *)0x11f969;
      pnVar10 = nn_list_begin(&::self.socktypes);
      pcStack_40 = (code *)0x11f974;
      pnVar9 = nn_list_end(&::self.socktypes);
      if (pnVar10 != pnVar9) {
        do {
          socktype = (nn_socktype *)(pnVar10 + -2);
          if (pnVar10 == (nn_list_item *)0x0) {
            socktype = (nn_socktype *)0x0;
          }
          if ((socktype->domain == domain) && (socktype->protocol == protocol)) {
            iVar5 = 0x250;
            pcStack_40 = (code *)0x11f9f5;
            self = (nn_sock *)nn_alloc_(0x250);
            if (self == (nn_sock *)0x0) goto LAB_0011fa4a;
            pcStack_40 = (code *)0x11fa0a;
            uVar4 = nn_sock_init(self,socktype,(uint)uVar1);
            if (-1 < (int)uVar4) {
              ::self.socks[uVar1] = self;
              ::self.nsocks = ::self.nsocks + 1;
              uVar4 = (uint)uVar1;
            }
            goto LAB_0011f9b7;
          }
          pcStack_40 = (code *)0x11f9a2;
          pnVar10 = nn_list_next(&::self.socktypes,pnVar10);
          pcStack_40 = (code *)0x11f9ad;
          pnVar9 = nn_list_end(&::self.socktypes);
        } while (pnVar10 != pnVar9);
      }
      uVar4 = 0xffffffea;
    }
    else {
      uVar4 = 0xffffffe8;
    }
LAB_0011f9b7:
    if (-1 < (int)uVar4) {
      pcStack_40 = (code *)0x11f9c0;
      nn_glock_unlock();
      return uVar4;
    }
    pcStack_40 = (code *)0x11f9c7;
    nn_global_term();
    pcStack_40 = (code *)0x11f9cc;
    nn_glock_unlock();
    pcStack_40 = (code *)0x11f9d3;
    piVar11 = __errno_location();
    *piVar11 = -uVar4;
  }
  else {
    pcStack_40 = (code *)0x11fa2d;
    nn_socket_cold_1();
  }
  return -1;
}

Assistant:

int nn_socket (int domain, int protocol)
{
    int rc;

    nn_glock_lock ();

    /*  If nn_term() was already called, return ETERM. */
    if (nn_slow (self.flags & NN_CTX_FLAG_ZOMBIE)) {
        nn_glock_unlock ();
        errno = ETERM;
        return -1;
    }

    /*  Make sure that global state is initialised. */
    nn_global_init ();

    rc = nn_global_create_socket (domain, protocol);

    if (rc < 0) {
        nn_global_term ();
        nn_glock_unlock ();
        errno = -rc;
        return -1;
    }

    nn_glock_unlock();

    return rc;
}